

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

void A64SysRegMapper_toString(A64SysRegMapper *S,uint32_t Bits,_Bool *Valid,char *result)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_64;
  uint i;
  char *Op2S;
  char *CRmS;
  char *CRnS;
  char *Op1S;
  uint32_t Op2;
  uint32_t CRm;
  uint32_t CRn;
  uint32_t Op1;
  uint32_t Op0;
  int dummy;
  char *result_local;
  _Bool *Valid_local;
  uint32_t Bits_local;
  A64SysRegMapper *S_local;
  
  for (local_64 = 0; local_64 < 0x1d8; local_64 = local_64 + 1) {
    if (SysRegPairs[local_64].Value == Bits) {
      *Valid = true;
      strcpy(result,SysRegPairs[local_64].Name);
      return;
    }
  }
  bVar1 = false;
  while (!bVar1) {
    if (CycloneSysRegPairs[0].Value == Bits) {
      *Valid = true;
      strcpy(result,CycloneSysRegPairs[0].Name);
      return;
    }
    bVar1 = true;
  }
  local_64 = 0;
  while( true ) {
    if (S->NumInstPairs <= (ulong)local_64) {
      uVar2 = Bits >> 7 & 0xf;
      if (((Bits >> 0xe & 3) == 3) && ((uVar2 == 0xb || (uVar2 == 0xf)))) {
        *Valid = true;
        pcVar3 = utostr((ulong)(Bits >> 0xb & 7),false);
        pcVar4 = utostr((ulong)uVar2,false);
        pcVar5 = utostr((ulong)(Bits >> 3 & 0xf),false);
        pcVar6 = utostr((ulong)(Bits & 7),false);
        sprintf(result,"s3_%s_c%s_c%s_%s",pcVar3,pcVar4,pcVar5,pcVar6);
        (*cs_mem_free)(pcVar3);
        (*cs_mem_free)(pcVar4);
        (*cs_mem_free)(pcVar5);
        (*cs_mem_free)(pcVar6);
      }
      else {
        *Valid = false;
      }
      return;
    }
    if (S->InstPairs[local_64].Value == Bits) break;
    local_64 = local_64 + 1;
  }
  *Valid = true;
  strcpy(result,S->InstPairs[local_64].Name);
  return;
}

Assistant:

void A64SysRegMapper_toString(A64SysRegMapper *S, uint32_t Bits, bool *Valid, char *result)
{
	int dummy;
	uint32_t Op0, Op1, CRn, CRm, Op2;
	char *Op1S, *CRnS, *CRmS, *Op2S;
	unsigned i;

	// First search the registers shared by all
	for (i = 0; i < ARR_SIZE(SysRegPairs); ++i) {
		if (SysRegPairs[i].Value == Bits) {
			*Valid = true;
			strcpy(result, SysRegPairs[i].Name);
			return;
		}
	}

	// Next search for target specific registers
	// if (FeatureBits & AArch64_ProcCyclone) {
	if (true) {
		for (i = 0; i < ARR_SIZE(CycloneSysRegPairs); ++i) {
			if (CycloneSysRegPairs[i].Value == Bits) {
				*Valid = true;
				strcpy(result, CycloneSysRegPairs[i].Name);
				return;
			}
		}
	}

	// Now try the instruction-specific registers (either read-only or
	// write-only).
	for (i = 0; i < S->NumInstPairs; ++i) {
		if (S->InstPairs[i].Value == Bits) {
			*Valid = true;
			strcpy(result, S->InstPairs[i].Name);
			return;
		}
	}

	Op0 = (Bits >> 14) & 0x3;
	Op1 = (Bits >> 11) & 0x7;
	CRn = (Bits >> 7) & 0xf;
	CRm = (Bits >> 3) & 0xf;
	Op2 = Bits & 0x7;

	// Only combinations matching: 11 xxx 1x11 xxxx xxx are valid for a generic
	// name.
	if (Op0 != 3 || (CRn != 11 && CRn != 15)) {
		*Valid = false;
		return;
	}

	//assert(Op0 == 3 && (CRn == 11 || CRn == 15) && "Invalid generic sysreg");

	*Valid = true;

	Op1S = utostr(Op1, false);
	CRnS = utostr(CRn, false);
	CRmS = utostr(CRm, false);
	Op2S = utostr(Op2, false);

	//printf("Op1S: %s, CRnS: %s, CRmS: %s, Op2S: %s\n", Op1S, CRnS, CRmS, Op2S);
	dummy = sprintf(result, "s3_%s_c%s_c%s_%s", Op1S, CRnS, CRmS, Op2S);
	(void)dummy;

	cs_mem_free(Op1S);
	cs_mem_free(CRnS);
	cs_mem_free(CRmS);
	cs_mem_free(Op2S);
}